

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O0

void __thiscall mocker::ast::VarDeclStmt::~VarDeclStmt(VarDeclStmt *this)

{
  VarDeclStmt *this_local;
  
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__VarDeclStmt_0039e028;
  std::shared_ptr<mocker::ast::Expression>::~shared_ptr(&this->initExpr);
  std::shared_ptr<mocker::ast::Identifier>::~shared_ptr(&this->identifier);
  std::shared_ptr<mocker::ast::Type>::~shared_ptr(&this->type);
  Statement::~Statement(&this->super_Statement);
  return;
}

Assistant:

VarDeclStmt(std::shared_ptr<Type> type,
              std::shared_ptr<Identifier> identifier,
              std::shared_ptr<Expression> initExpr = nullptr)
      : type(std::move(type)), identifier(std::move(identifier)),
        initExpr(std::move(initExpr)) {}